

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STVector256.cpp
# Opt level: O3

bool __thiscall jbcoin::STVector256::isEquivalent(STVector256 *this,STBase *t)

{
  pointer pbVar1;
  long lVar2;
  pointer pbVar3;
  bool bVar4;
  long lVar5;
  
  bVar4 = false;
  lVar2 = __dynamic_cast(t,&STBase::typeinfo,&typeinfo,0);
  if (lVar2 != 0) {
    pbVar3 = (this->mValue).
             super__Vector_base<jbcoin::base_uint<256UL,_void>,_std::allocator<jbcoin::base_uint<256UL,_void>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar1 = (this->mValue).
             super__Vector_base<jbcoin::base_uint<256UL,_void>,_std::allocator<jbcoin::base_uint<256UL,_void>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    lVar5 = *(long *)(lVar2 + 0x10);
    if ((long)pbVar1 - (long)pbVar3 == *(long *)(lVar2 + 0x18) - lVar5) {
      bVar4 = true;
      for (; pbVar3 != pbVar1; pbVar3 = pbVar3 + 1) {
        lVar2 = 0;
        do {
          if (*(char *)((long)pbVar3->pn + lVar2) != *(char *)(lVar5 + lVar2)) {
            if (lVar2 != 0x20) goto LAB_001bb1cd;
            break;
          }
          lVar2 = lVar2 + 1;
        } while (lVar2 != 0x20);
        lVar5 = lVar5 + 0x20;
      }
    }
    else {
LAB_001bb1cd:
      bVar4 = false;
    }
  }
  return bVar4;
}

Assistant:

bool
STVector256::isEquivalent (const STBase& t) const
{
    const STVector256* v = dynamic_cast<const STVector256*> (&t);
    return v && (mValue == v->mValue);
}